

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O3

DdNode * cuddBddTransferPermuteRecur
                   (DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table,int *Permute)

{
  int *piVar1;
  DdManager *ddD_00;
  int iVar2;
  DdNode *h;
  ulong uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  uint *key;
  DdNode *res;
  DdNode *local_48;
  int local_3c;
  DdNode *local_38;
  
  pDVar4 = ddS->one;
  key = (uint *)((ulong)ddD & 0xfffffffffffffffe);
  uVar3 = (ulong)((uint)ddD & 1);
  if (*key == 0x7fffffff) {
    pDVar4 = (DdNode *)(uVar3 ^ (ulong)pDVar4);
  }
  else {
    iVar2 = st__lookup((st__table *)f,(char *)key,(char **)&local_48);
    if (iVar2 == 0) {
      local_3c = *(int *)((long)&table->compare + (ulong)*key * 4);
      ddD_00 = *(DdManager **)(key + 6);
      local_38 = cuddBddTransferPermuteRecur(ddS,*(DdManager **)(key + 4),f,table,Permute);
      if (local_38 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)local_38 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        h = cuddBddTransferPermuteRecur(ddS,ddD_00,f,table,Permute);
        pDVar5 = local_38;
        if (h != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar4 = cuddUniqueInter(ddS,local_3c,pDVar4,(DdNode *)((ulong)pDVar4 ^ 1));
          if ((pDVar4 == (DdNode *)0x0) ||
             (local_48 = cuddBddIteRecur(ddS,pDVar4,pDVar5,h), local_48 == (DdNode *)0x0)) {
            Cudd_RecursiveDeref(ddS,pDVar5);
            pDVar5 = h;
          }
          else {
            piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(ddS,pDVar5);
            Cudd_RecursiveDeref(ddS,h);
            iVar2 = st__add_direct((st__table *)f,(char *)key,(char *)local_48);
            pDVar5 = local_48;
            if (iVar2 != -10000) {
              return (DdNode *)(uVar3 ^ (ulong)local_48);
            }
          }
        }
        Cudd_RecursiveDeref(ddS,pDVar5);
      }
      pDVar4 = (DdNode *)0x0;
    }
    else {
      pDVar4 = (DdNode *)(uVar3 ^ (ulong)local_48);
    }
  }
  return pDVar4;
}

Assistant:

static DdNode *
cuddBddTransferPermuteRecur( DdManager * ddS,
                      DdManager * ddD, DdNode * f, st__table * table, int * Permute )
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int index;
    int comple = 0;

    statLine( ddD );
    one = DD_ONE( ddD );
    comple = Cudd_IsComplement( f );

    /* Trivial cases. */
    if ( Cudd_IsConstant( f ) )
        return ( Cudd_NotCond( one, comple ) );

    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond( f, comple );
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup( table, ( char * ) f, ( char ** ) &res ) )
        return ( Cudd_NotCond( res, comple ) );

    /* Recursive step. */
    index = Permute[f->index];
    ft = cuddT( f );
    fe = cuddE( f );

    t = cuddBddTransferPermuteRecur( ddS, ddD, ft, table, Permute );
    if ( t == NULL )
    {
        return ( NULL );
    }
    cuddRef( t );

    e = cuddBddTransferPermuteRecur( ddS, ddD, fe, table, Permute );
    if ( e == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        return ( NULL );
    }
    cuddRef( e );

    zero = Cudd_Not( one );
    var = cuddUniqueInter( ddD, index, one, zero );
    if ( var == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    res = cuddBddIteRecur( ddD, var, t, e );
    if ( res == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_RecursiveDeref( ddD, t );
    Cudd_RecursiveDeref( ddD, e );

    if ( st__add_direct( table, ( char * ) f, ( char * ) res ) ==
         st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( ddD, res );
        return ( NULL );
    }
    return ( Cudd_NotCond( res, comple ) );

}